

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManMarkDangling(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = p->nObjs;
  iVar2 = 0;
  if (0 < (int)uVar5) {
    pGVar4 = p->pObjs;
    if (pGVar4 != (Gia_Obj_t *)0x0) {
      lVar3 = 0;
      do {
        uVar1 = *(ulong *)pGVar4;
        *(ulong *)pGVar4 = uVar1 & 0xffffffffbfffffff;
        uVar6 = uVar1 & 0x1fffffff;
        if (uVar6 == 0x1fffffff || (int)uVar1 < 0) {
          if ((int)uVar1 < 0 && (int)uVar6 != 0x1fffffff) goto LAB_00790f1f;
        }
        else {
          pGVar4[-uVar6].field_0x3 = pGVar4[-uVar6].field_0x3 | 0x40;
          uVar6 = (ulong)(*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
LAB_00790f1f:
          pGVar4[-uVar6].field_0x3 = pGVar4[-uVar6].field_0x3 | 0x40;
        }
        lVar3 = lVar3 + 1;
        uVar5 = p->nObjs;
      } while ((lVar3 < (int)uVar5) && (pGVar4 = p->pObjs + lVar3, p->pObjs != (Gia_Obj_t *)0x0));
    }
    iVar2 = 0;
    if (0 < (int)uVar5) {
      lVar3 = 0;
      iVar2 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return 0;
        }
        uVar1 = *(ulong *)(&p->pObjs->field_0x0 + lVar3);
        iVar2 = iVar2 + (uint)((uVar1 & 0xc0000000) == 0 && (~(uint)uVar1 & 0x1fffffff) != 0);
        lVar3 = lVar3 + 0xc;
      } while ((ulong)uVar5 * 0xc != lVar3);
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManMarkDangling( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    Gia_ManForEachAnd( p, pObj, i )
        Counter += !pObj->fMark0;
    return Counter;
}